

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O0

int doinvbill(int mode)

{
  short sVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  monst *mtmp;
  obj *poVar5;
  nh_menuitem *pnVar6;
  long cost;
  long local_c0;
  nh_menuitem *_item__6;
  nh_menuitem *_item__5;
  nh_menuitem *_item__4;
  nh_menuitem *_item__3;
  nh_menuitem *_item__2;
  uint save_unpaid;
  long thisused;
  long uquan;
  long oquan;
  nh_menuitem *_item__1;
  nh_menuitem *_item_;
  undefined1 auStack_58 [4];
  int cnt;
  menulist menu;
  char *buf_p;
  long totused;
  obj *obj;
  bill_x *end_bp;
  bill_x *bp;
  eshk *eshkp;
  monst *shkp;
  int mode_local;
  
  mtmp = shop_keeper(level,u.ushops[0]);
  if ((mtmp == (monst *)0x0) || (iVar4 = inhishop(mtmp), iVar4 == 0)) {
    if (mode != 0) {
      warning("doinvbill: no shopkeeper?");
    }
    shkp._4_4_ = 0;
  }
  else if (mode == 0) {
    _item_._4_4_ = (uint)(*(int *)&mtmp[0x1b].field_0x60 != 0);
    lVar3 = *(long *)&mtmp[0x1b].mnum;
    sVar1 = *(short *)((long)&mtmp[0x1b].misc_worn_check + 2);
    for (end_bp = *(bill_x **)&mtmp[0x1b].mnum; end_bp < (bill_x *)(lVar3 + (long)sVar1 * 0x10);
        end_bp = end_bp + 1) {
      if ((end_bp->useup != '\0') ||
         ((poVar5 = bp_to_obj(end_bp), poVar5 != (obj *)0x0 && (poVar5->quan < end_bp->bquan)))) {
        _item_._4_4_ = _item_._4_4_ + 1;
      }
    }
    shkp._4_4_ = _item_._4_4_;
  }
  else {
    init_menulist((menulist *)auStack_58);
    if ((int)menu.items <= menu.items._4_4_) {
      menu.items._0_4_ = (int)menu.items << 1;
      _auStack_58 = (nh_menuitem *)realloc(_auStack_58,(long)(int)menu.items * 0x10c);
    }
    pnVar6 = _auStack_58 + menu.items._4_4_;
    pnVar6->id = 0;
    pnVar6->role = MI_TEXT;
    pnVar6->accel = '\0';
    pnVar6->group_accel = '\0';
    pnVar6->selected = '\0';
    strcpy(pnVar6->caption,"Unpaid articles already used up:");
    menu.items._4_4_ = menu.items._4_4_ + 1;
    if ((int)menu.items <= menu.items._4_4_) {
      menu.items._0_4_ = (int)menu.items << 1;
      _auStack_58 = (nh_menuitem *)realloc(_auStack_58,(long)(int)menu.items * 0x10c);
    }
    pnVar6 = _auStack_58 + menu.items._4_4_;
    pnVar6->id = 0;
    pnVar6->role = MI_TEXT;
    pnVar6->accel = '\0';
    pnVar6->group_accel = '\0';
    pnVar6->selected = '\0';
    strcpy(pnVar6->caption,"");
    menu.items._4_4_ = menu.items._4_4_ + 1;
    buf_p = (char *)0x0;
    lVar3 = *(long *)&mtmp[0x1b].mnum;
    sVar1 = *(short *)((long)&mtmp[0x1b].misc_worn_check + 2);
    for (end_bp = *(bill_x **)&mtmp[0x1b].mnum; end_bp < (bill_x *)(lVar3 + (long)sVar1 * 0x10);
        end_bp = end_bp + 1) {
      poVar5 = bp_to_obj(end_bp);
      if (poVar5 == (obj *)0x0) {
        warning("Bad shopkeeper administration.");
        goto LAB_002cfc68;
      }
      if ((end_bp->useup != '\0') || (poVar5->quan < end_bp->bquan)) {
        uVar2 = *(uint *)&poVar5->field_0x4a;
        if (end_bp->useup == '\0') {
          local_c0 = (long)end_bp->bquan - (long)poVar5->quan;
        }
        else {
          local_c0 = (long)end_bp->bquan;
        }
        cost = end_bp->price * local_c0;
        buf_p = buf_p + cost;
        *(uint *)&poVar5->field_0x4a = *(uint *)&poVar5->field_0x4a & 0xfffffffb;
        menu._8_8_ = xprname(poVar5,(char *)0x0,'x','\0',cost,local_c0);
        *(uint *)&poVar5->field_0x4a =
             *(uint *)&poVar5->field_0x4a & 0xfffffffb | (uVar2 >> 2 & 1) << 2;
        if ((int)menu.items <= menu.items._4_4_) {
          menu.items._0_4_ = (int)menu.items << 1;
          _auStack_58 = (nh_menuitem *)realloc(_auStack_58,(long)(int)menu.items * 0x10c);
        }
        pnVar6 = _auStack_58 + menu.items._4_4_;
        pnVar6->id = 0;
        pnVar6->role = MI_TEXT;
        pnVar6->accel = '\0';
        pnVar6->group_accel = '\0';
        pnVar6->selected = '\0';
        strcpy(pnVar6->caption,(char *)menu._8_8_);
        menu.items._4_4_ = menu.items._4_4_ + 1;
      }
    }
    if (*(int *)&mtmp[0x1b].field_0x60 != 0) {
      if (buf_p != (char *)0x0) {
        if ((int)menu.items <= menu.items._4_4_) {
          menu.items._0_4_ = (int)menu.items << 1;
          _auStack_58 = (nh_menuitem *)realloc(_auStack_58,(long)(int)menu.items * 0x10c);
        }
        pnVar6 = _auStack_58 + menu.items._4_4_;
        pnVar6->id = 0;
        pnVar6->role = MI_TEXT;
        pnVar6->accel = '\0';
        pnVar6->group_accel = '\0';
        pnVar6->selected = '\0';
        strcpy(pnVar6->caption,"");
        menu.items._4_4_ = menu.items._4_4_ + 1;
      }
      buf_p = buf_p + *(int *)&mtmp[0x1b].field_0x60;
      menu._8_8_ = xprname((obj *)0x0,"usage charges and/or other fees",'$','\0',
                           (long)*(int *)&mtmp[0x1b].field_0x60,0);
      if ((int)menu.items <= menu.items._4_4_) {
        menu.items._0_4_ = (int)menu.items << 1;
        _auStack_58 = (nh_menuitem *)realloc(_auStack_58,(long)(int)menu.items * 0x10c);
      }
      pnVar6 = _auStack_58 + menu.items._4_4_;
      pnVar6->id = 0;
      pnVar6->role = MI_TEXT;
      pnVar6->accel = '\0';
      pnVar6->group_accel = '\0';
      pnVar6->selected = '\0';
      strcpy(pnVar6->caption,(char *)menu._8_8_);
      menu.items._4_4_ = menu.items._4_4_ + 1;
    }
    menu._8_8_ = xprname((obj *)0x0,"Total:",'*','\0',(long)buf_p,0);
    if ((int)menu.items <= menu.items._4_4_) {
      menu.items._0_4_ = (int)menu.items << 1;
      _auStack_58 = (nh_menuitem *)realloc(_auStack_58,(long)(int)menu.items * 0x10c);
    }
    pnVar6 = _auStack_58 + menu.items._4_4_;
    pnVar6->id = 0;
    pnVar6->role = MI_TEXT;
    pnVar6->accel = '\0';
    pnVar6->group_accel = '\0';
    pnVar6->selected = '\0';
    strcpy(pnVar6->caption,"");
    menu.items._4_4_ = menu.items._4_4_ + 1;
    if ((int)menu.items <= menu.items._4_4_) {
      menu.items._0_4_ = (int)menu.items << 1;
      _auStack_58 = (nh_menuitem *)realloc(_auStack_58,(long)(int)menu.items * 0x10c);
    }
    pnVar6 = _auStack_58 + menu.items._4_4_;
    pnVar6->id = 0;
    pnVar6->role = MI_TEXT;
    pnVar6->accel = '\0';
    pnVar6->group_accel = '\0';
    pnVar6->selected = '\0';
    strcpy(pnVar6->caption,(char *)menu._8_8_);
    menu.items._4_4_ = menu.items._4_4_ + 1;
    display_menu(_auStack_58,menu.items._4_4_,(char *)0x0,0,(int *)0x0);
LAB_002cfc68:
    free(_auStack_58);
    shkp._4_4_ = 0;
  }
  return shkp._4_4_;
}

Assistant:

int doinvbill(int mode)
{
	struct monst *shkp;
	struct eshk *eshkp;
	struct bill_x *bp, *end_bp;
	struct obj *obj;
	long totused;
	char *buf_p;
	struct menulist menu;

	shkp = shop_keeper(level, *u.ushops);
	if (!shkp || !inhishop(shkp)) {
	    if (mode != 0) warning("doinvbill: no shopkeeper?");
	    return 0;
	}
	eshkp = ESHK(shkp);

	if (mode == 0) {
	    /* count expended items, so that the `I' command can decide
	       whether to include 'x' in its prompt string */
	    int cnt = !eshkp->debit ? 0 : 1;

	    for (bp = eshkp->bill_p, end_bp = &eshkp->bill_p[eshkp->billct];
		    bp < end_bp; bp++)
		if (bp->useup ||
			((obj = bp_to_obj(bp)) != 0 && obj->quan < bp->bquan))
		    cnt++;
	    return cnt;
	}

	init_menulist(&menu);
	add_menutext(&menu, "Unpaid articles already used up:");
	add_menutext(&menu, "");

	totused = 0L;
	for (bp = eshkp->bill_p, end_bp = &eshkp->bill_p[eshkp->billct];
		bp < end_bp; bp++) {
	    obj = bp_to_obj(bp);
	    if (!obj) {
		warning("Bad shopkeeper administration.");
		goto quit;
	    }
	    if (bp->useup || bp->bquan > obj->quan) {
		long oquan, uquan, thisused;
		unsigned save_unpaid;

		save_unpaid = obj->unpaid;
		oquan = obj->quan;
		uquan = (bp->useup ? bp->bquan : bp->bquan - oquan);
		thisused = bp->price * uquan;
		totused += thisused;
		obj->unpaid = 0;		/* ditto */
		/* Why 'x'?  To match `I x', more or less. */
		buf_p = xprname(obj, NULL, 'x', FALSE, thisused, uquan);
		obj->unpaid = save_unpaid;
		add_menutext(&menu, buf_p);
	    }
	}
	if (eshkp->debit) {
	    /* additional shop debt which has no itemization available */
	    if (totused) add_menutext(&menu, "");
	    totused += eshkp->debit;
	    buf_p = xprname(NULL,
			    "usage charges and/or other fees",
			    GOLD_SYM, FALSE, eshkp->debit, 0L);
	    add_menutext(&menu, buf_p);
	}
	buf_p = xprname(NULL, "Total:", '*', FALSE, totused, 0L);
	add_menutext(&menu, "");
	add_menutext(&menu, buf_p);
	
	display_menu(menu.items, menu.icount, NULL, PICK_NONE, NULL);
    quit:
	free(menu.items);
	return 0;
}